

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::startRecording
          (AeronArchive *this,string *channel,int32_t streamId,Value sourceLocation)

{
  int64_t iVar1;
  Value sourceLocation_local;
  int32_t streamId_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  sourceLocation_local = sourceLocation;
  streamId_local = streamId;
  local_38._M_unused._M_object = operator_new(0x20);
  *(AeronArchive **)local_38._M_unused._0_8_ = this;
  *(string **)((long)local_38._M_unused._0_8_ + 8) = channel;
  *(int32_t **)((long)local_38._M_unused._0_8_ + 0x10) = &streamId_local;
  *(Value **)((long)local_38._M_unused._0_8_ + 0x18) = &sourceLocation_local;
  pcStack_20 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:156:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:156:9)>
             ::_M_manager;
  iVar1 = callAndPollForResponse(this,(function<bool_(long)> *)&local_38,"start recording");
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::startRecording(const std::string& channel, std::int32_t streamId,
                                          codecs::SourceLocation::Value sourceLocation) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->startRecording(channel, streamId, sourceLocation, correlationId, controlSessionId_);
        },
        "start recording");
}